

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_opt_mem.c
# Opt level: O0

AliasRet aa_uref(IRIns *refa,IRIns *refb)

{
  IRIns *refb_local;
  IRIns *refa_local;
  
  if ((refa->field_0).op1 == (refb->field_0).op1) {
    if ((refa->field_0).op2 == (refb->field_0).op2) {
      refa_local._4_4_ = ALIAS_MUST;
    }
    else {
      refa_local._4_4_ = ALIAS_NO;
    }
  }
  else if ((((refa->field_0).op2 ^ (refb->field_0).op2) & 0xff) == 0) {
    if ((refa->field_1).o == (refb->field_1).o) {
      refa_local._4_4_ = ALIAS_MAY;
    }
    else {
      if (((refa->field_1).t.irt & 0x1f) == 0x15) {
        (refa->field_1).t.irt = (refa->field_1).t.irt + 0xf4;
      }
      else if (((refb->field_1).t.irt & 0x1f) == 0x15) {
        (refb->field_1).t.irt = (refb->field_1).t.irt + 0xf4;
      }
      refa_local._4_4_ = ALIAS_NO;
    }
  }
  else {
    refa_local._4_4_ = ALIAS_NO;
  }
  return refa_local._4_4_;
}

Assistant:

static AliasRet aa_uref(IRIns *refa, IRIns *refb)
{
  if (refa->op1 == refb->op1) {  /* Same function. */
    if (refa->op2 == refb->op2)
      return ALIAS_MUST;  /* Same function, same upvalue idx. */
    else
      return ALIAS_NO;  /* Same function, different upvalue idx. */
  } else {  /* Different functions, check disambiguation hash values. */
    if (((refa->op2 ^ refb->op2) & 0xff)) {
      return ALIAS_NO;  /* Upvalues with different hash values cannot alias. */
    } else if (refa->o != refb->o) {
      /* Different UREFx type, but need to confirm the UREFO really is open. */
      if (irt_type(refa->t) == IRT_IGC) refa->t.irt += IRT_PGC-IRT_IGC;
      else if (irt_type(refb->t) == IRT_IGC) refb->t.irt += IRT_PGC-IRT_IGC;
      return ALIAS_NO;
    } else {
      /* No conclusion can be drawn for same hash value and same UREFx type. */
      return ALIAS_MAY;
    }
  }
}